

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

size_t mpack_expect_key_cstr(mpack_reader_t *reader,char **keys,_Bool *found,size_t count)

{
  size_t sVar1;
  
  sVar1 = mpack_expect_enum_optional(reader,keys,count);
  if (sVar1 != count) {
    if (found[sVar1] == true) {
      if (reader->error == mpack_ok) {
        reader->error = mpack_error_invalid;
        reader->end = reader->data;
        if (reader->error_fn != (mpack_reader_error_t)0x0) {
          (*reader->error_fn)(reader,mpack_error_invalid);
        }
      }
    }
    else {
      found[sVar1] = true;
      count = sVar1;
    }
  }
  return count;
}

Assistant:

size_t mpack_expect_key_cstr(mpack_reader_t* reader, const char* keys[], bool found[], size_t count) {
    size_t i = mpack_expect_enum_optional(reader, keys, count);

    // unrecognized keys are fine, we just return count
    if (i == count)
        return count;

    // check if this key is a duplicate
    mpack_assert(found != NULL, "found cannot be NULL");
    if (found[i]) {
        mpack_reader_flag_error(reader, mpack_error_invalid);
        return count;
    }

    found[i] = true;
    return i;
}